

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unixClose(unqlite_file *id)

{
  _func_int_unqlite_file_ptr_void_ptr_unqlite_int64_unqlite_int64 **pp_Var1;
  unqlite_io_methods *pChunk;
  unqlite_io_methods *puVar2;
  int iVar3;
  unixInodeInfo **ppuVar4;
  int *piVar5;
  unixInodeInfo *pInode;
  
  if (id == (unqlite_file *)0x0) {
    return 0;
  }
  unixUnlock(id,0);
  pChunk = id[1].pMethods;
  if (pChunk != (unqlite_io_methods *)0x0) {
    if (*(int *)((long)&pChunk->xWrite + 4) != 0) {
      puVar2 = id[5].pMethods;
      puVar2->xClose = (_func_int_unqlite_file_ptr *)pChunk->xTruncate;
      pChunk->xTruncate = (_func_int_unqlite_file_ptr_unqlite_int64 *)puVar2;
      *(undefined4 *)&id[2].pMethods = 0xffffffff;
      id[5].pMethods = (unqlite_io_methods *)0x0;
    }
    if (pChunk != (unqlite_io_methods *)0x0) {
      pp_Var1 = &pChunk->xWrite;
      *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
      if (*(int *)pp_Var1 == 0) {
        closePendingFds((unixFile *)id);
        ppuVar4 = &inodeList;
        if (pChunk->xFileSize != (_func_int_unqlite_file_ptr_unqlite_int64_ptr *)0x0) {
          ppuVar4 = (unixInodeInfo **)(pChunk->xFileSize + 0x28);
        }
        *ppuVar4 = (unixInodeInfo *)pChunk->xSync;
        if (pChunk->xSync != (_func_int_unqlite_file_ptr_int *)0x0) {
          *(_func_int_unqlite_file_ptr_unqlite_int64_ptr **)(pChunk->xSync + 0x30) =
               pChunk->xFileSize;
        }
        SyMemBackendFree(&sUnqlMPGlobal.sAllocator,pChunk);
      }
    }
  }
  iVar3 = *(int *)((long)&id[2].pMethods + 4);
  if (-1 < iVar3) {
    iVar3 = close(iVar3);
    if (iVar3 != 0) {
      piVar5 = __errno_location();
      *(int *)((long)&id[3].pMethods + 4) = *piVar5;
      return -2;
    }
    *(undefined4 *)((long)&id[2].pMethods + 4) = 0xffffffff;
  }
  if ((-1 < *(int *)&id[2].pMethods) && (iVar3 = close(*(int *)&id[2].pMethods), iVar3 != 0)) {
    piVar5 = __errno_location();
    *(int *)((long)&id[3].pMethods + 4) = *piVar5;
    return -2;
  }
  SyMemBackendFree(&sUnqlMPGlobal.sAllocator,id[5].pMethods);
  id[6].pMethods = (unqlite_io_methods *)0x0;
  id[7].pMethods = (unqlite_io_methods *)0x0;
  id[4].pMethods = (unqlite_io_methods *)0x0;
  id[5].pMethods = (unqlite_io_methods *)0x0;
  id[2].pMethods = (unqlite_io_methods *)0x0;
  id[3].pMethods = (unqlite_io_methods *)0x0;
  id->pMethods = (unqlite_io_methods *)0x0;
  id[1].pMethods = (unqlite_io_methods *)0x0;
  id[8].pMethods = (unqlite_io_methods *)0x0;
  return 0;
}

Assistant:

static int unixClose(unqlite_file *id){
  int rc = UNQLITE_OK;
  if( id ){
    unixFile *pFile = (unixFile *)id;
    unixUnlock(id, NO_LOCK);
    unixEnterMutex();
    if( pFile->pInode && pFile->pInode->nLock ){
      /* If there are outstanding locks, do not actually close the file just
      ** yet because that would clear those locks.  Instead, add the file
      ** descriptor to pInode->pUnused list.  It will be automatically closed 
      ** when the last lock is cleared.
      */
      setPendingFd(pFile);
    }
    releaseInodeInfo(pFile);
    rc = closeUnixFile(id);
    unixLeaveMutex();
  }
  return rc;
}